

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O1

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CEseqFloatVisitor::processSourceEseqInCMove
          (CEseqFloatVisitor *this,CExpression *target,CEseqExpression *sourceEseq)

{
  bool bVar1;
  CExpression *pCVar2;
  long lVar3;
  CStatement *pCVar4;
  CSeqStatement *pCVar5;
  CMoveStatement *pCVar6;
  CMemExpression *pCVar7;
  long *plVar8;
  tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_> this_00;
  CSeqStatement *this_01;
  CTempExpression *this_02;
  CEseqExpression *in_RCX;
  CTemp temp;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_100;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_f8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_f0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_e8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_e0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_d8;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_d0;
  __uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_c8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_c0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_b8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_b0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_a8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_a0;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_98;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_90;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_88;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_80;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_78;
  _Head_base<0UL,_const_IRT::CExpression_*,_false> local_70;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_68;
  undefined1 local_60 [32];
  CSeqStatement *local_40;
  CMoveStatement *local_38;
  
  pCVar2 = CEseqExpression::getExpression(in_RCX);
  if ((pCVar2 != (CExpression *)0x0) &&
     (lVar3 = __dynamic_cast(pCVar2,&CExpression::typeinfo,&CEseqExpression::typeinfo,0), lVar3 != 0
     )) {
    __assert_fail("eseq == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CEseqFloatVisitor.cpp"
                  ,0x11c,
                  "std::unique_ptr<const IRT::CStatement> IRT::CEseqFloatVisitor::processSourceEseqInCMove(const IRT::CExpression *, const IRT::CEseqExpression *)"
                 );
  }
  pCVar4 = CEseqExpression::getStatement(in_RCX);
  bVar1 = isExpCommuteWithStm(&sourceEseq->super_CExpression,pCVar4);
  if (bVar1) {
    pCVar5 = (CSeqStatement *)operator_new(0x18);
    pCVar4 = CEseqExpression::getStatement(in_RCX);
    (*(pCVar4->super_IStatement).super_INode._vptr_INode[3])(local_60,pCVar4);
    local_b0._M_head_impl = (CStatement *)local_60._0_8_;
    local_60._0_8_ = (long *)0x0;
    pCVar6 = (CMoveStatement *)operator_new(0x18);
    (*(sourceEseq->super_CExpression).super_IExpression.super_INode._vptr_INode[3])
              (&local_f8,sourceEseq);
    local_b8._M_head_impl = local_f8._M_head_impl;
    local_f8._M_head_impl = (CExpression *)0x0;
    pCVar2 = CEseqExpression::getExpression(in_RCX);
    (*(pCVar2->super_IExpression).super_INode._vptr_INode[3])(&local_100,pCVar2);
    local_70._M_head_impl = local_100._M_head_impl;
    local_100._M_head_impl = (CExpression *)0x0;
    CMoveStatement::CMoveStatement
              (pCVar6,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_b8,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_70);
    local_68._M_head_impl = (CStatement *)pCVar6;
    CSeqStatement::CSeqStatement
              (pCVar5,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_b0,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_68);
    (this->super_IVisitor)._vptr_IVisitor = (_func_int **)pCVar5;
    if ((CMoveStatement *)local_68._M_head_impl != (CMoveStatement *)0x0) {
      (*((INode *)&((local_68._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_68._M_head_impl = (CStatement *)0x0;
    if (local_70._M_head_impl != (CExpression *)0x0) {
      (*((local_70._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_70._M_head_impl = (CExpression *)0x0;
    if (local_100._M_head_impl != (CExpression *)0x0) {
      (*((local_100._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if (local_b8._M_head_impl != (CExpression *)0x0) {
      (*((local_b8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_b8._M_head_impl = (CExpression *)0x0;
    if (local_f8._M_head_impl != (CExpression *)0x0) {
      (*((local_f8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if (local_b0._M_head_impl != (CStatement *)0x0) {
      (*((local_b0._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_b0._M_head_impl = (CStatement *)0x0;
  }
  else {
    if (sourceEseq == (CEseqExpression *)0x0) {
      pCVar7 = (CMemExpression *)0x0;
      plVar8 = (long *)0x0;
    }
    else {
      pCVar7 = (CMemExpression *)
               __dynamic_cast(sourceEseq,&CExpression::typeinfo,&CMemExpression::typeinfo,0);
      plVar8 = (long *)__dynamic_cast(sourceEseq,&CExpression::typeinfo,&CTempExpression::typeinfo,0
                                     );
    }
    if (pCVar7 == (CMemExpression *)0x0 && plVar8 == (long *)0x0) {
      __assert_fail("memTarget != nullptr || tempTarget != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/visitors/CEseqFloatVisitor.cpp"
                    ,299,
                    "std::unique_ptr<const IRT::CStatement> IRT::CEseqFloatVisitor::processSourceEseqInCMove(const IRT::CExpression *, const IRT::CEseqExpression *)"
                   );
    }
    if (pCVar7 != (CMemExpression *)0x0) {
      CTemp::CTemp((CTemp *)local_60);
      local_40 = (CSeqStatement *)operator_new(0x18);
      local_38 = (CMoveStatement *)operator_new(0x18);
      this_00.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           )operator_new(0x28);
      CTempExpression::CTempExpression
                ((CTempExpression *)
                 this_00.
                 super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                 .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl,
                 (CTemp *)local_60);
      local_c8._M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
           (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
           (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
           this_00.
           super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
      pCVar2 = CMemExpression::getAddress(pCVar7);
      (*(pCVar2->super_IExpression).super_INode._vptr_INode[3])(&local_f8,pCVar2);
      pCVar6 = local_38;
      local_78._M_head_impl = local_f8._M_head_impl;
      local_f8._M_head_impl = (CExpression *)0x0;
      CMoveStatement::CMoveStatement
                (local_38,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                           *)&local_c8,
                 (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *
                 )&local_78);
      local_c0._M_head_impl = &pCVar6->super_CStatement;
      this_01 = (CSeqStatement *)operator_new(0x18);
      pCVar4 = CEseqExpression::getStatement(in_RCX);
      (*(pCVar4->super_IStatement).super_INode._vptr_INode[3])(&local_100,pCVar4);
      local_d0._M_head_impl = local_100._M_head_impl;
      local_100._M_head_impl = (CExpression *)0x0;
      pCVar6 = (CMoveStatement *)operator_new(0x18);
      pCVar7 = (CMemExpression *)operator_new(0x10);
      this_02 = (CTempExpression *)operator_new(0x28);
      CTempExpression::CTempExpression(this_02,(CTemp *)local_60);
      local_90._M_head_impl = (CExpression *)this_02;
      CMemExpression::CMemExpression
                (pCVar7,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                         *)&local_90);
      local_d8._M_head_impl = (CExpression *)pCVar7;
      pCVar2 = CEseqExpression::getExpression(in_RCX);
      (*(pCVar2->super_IExpression).super_INode._vptr_INode[3])(&local_e0,pCVar2);
      local_98._M_head_impl = local_e0._M_head_impl;
      local_e0._M_head_impl = (CExpression *)0x0;
      CMoveStatement::CMoveStatement
                (pCVar6,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                         *)&local_d8,
                 (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *
                 )&local_98);
      local_88._M_head_impl = (CStatement *)pCVar6;
      CSeqStatement::CSeqStatement
                (this_01,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                          *)&local_d0,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_88);
      pCVar5 = local_40;
      local_80._M_head_impl = (CStatement *)this_01;
      CSeqStatement::CSeqStatement
                (local_40,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                           *)&local_c0,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_80);
      (this->super_IVisitor)._vptr_IVisitor = (_func_int **)pCVar5;
      if ((CSeqStatement *)local_80._M_head_impl != (CSeqStatement *)0x0) {
        (*((INode *)&((local_80._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
          _vptr_INode[2])();
      }
      local_80._M_head_impl = (CStatement *)0x0;
      if ((CMoveStatement *)local_88._M_head_impl != (CMoveStatement *)0x0) {
        (*((INode *)&((local_88._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
          _vptr_INode[2])();
      }
      local_88._M_head_impl = (CStatement *)0x0;
      if (local_98._M_head_impl != (CExpression *)0x0) {
        (*((local_98._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
      }
      local_98._M_head_impl = (CExpression *)0x0;
      if (local_e0._M_head_impl != (CExpression *)0x0) {
        (*((local_e0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
      }
      if ((CMemExpression *)local_d8._M_head_impl != (CMemExpression *)0x0) {
        (*(((CExpression *)&(local_d8._M_head_impl)->super_IExpression)->super_IExpression).
          super_INode._vptr_INode[2])();
      }
      local_d8._M_head_impl = (CExpression *)0x0;
      if ((CTempExpression *)local_90._M_head_impl != (CTempExpression *)0x0) {
        (*(((CExpression *)&(local_90._M_head_impl)->super_IExpression)->super_IExpression).
          super_INode._vptr_INode[2])();
      }
      local_90._M_head_impl = (CExpression *)0x0;
      if (local_d0._M_head_impl != (CExpression *)0x0) {
        (*((local_d0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
      }
      local_d0._M_head_impl = (CExpression *)0x0;
      if (local_100._M_head_impl != (CExpression *)0x0) {
        (*((local_100._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
      }
      if ((CMoveStatement *)local_c0._M_head_impl != (CMoveStatement *)0x0) {
        (*((INode *)&((local_c0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
          _vptr_INode[2])();
      }
      local_c0._M_head_impl = (CStatement *)0x0;
      if (local_78._M_head_impl != (CExpression *)0x0) {
        (*((local_78._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
      }
      local_78._M_head_impl = (CExpression *)0x0;
      if (local_f8._M_head_impl != (CExpression *)0x0) {
        (*((local_f8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
      }
      if (local_c8._M_t.
          super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
          .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
          0x0) {
        (**(code **)(*(long *)local_c8._M_t.
                              super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                              .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl +
                    0x10))();
      }
      local_c8._M_t.
      super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
      .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
           (tuple<const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>)
           (_Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
           )0x0;
      if ((CStatement *)local_60._0_8_ == (CStatement *)(local_60 + 0x10)) {
        return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
                )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
                  )this;
      }
      operator_delete((void *)local_60._0_8_);
      return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
              )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
                )this;
    }
    pCVar5 = (CSeqStatement *)operator_new(0x18);
    pCVar4 = CEseqExpression::getStatement(in_RCX);
    (*(pCVar4->super_IStatement).super_INode._vptr_INode[3])(local_60,pCVar4);
    local_e8._M_head_impl = (CStatement *)local_60._0_8_;
    local_60._0_8_ = (long *)0x0;
    pCVar6 = (CMoveStatement *)operator_new(0x18);
    (**(code **)(*plVar8 + 0x18))(&local_f8,plVar8);
    local_f0._M_head_impl = local_f8._M_head_impl;
    local_f8._M_head_impl = (CExpression *)0x0;
    pCVar2 = CEseqExpression::getExpression(in_RCX);
    (*(pCVar2->super_IExpression).super_INode._vptr_INode[3])(&local_100,pCVar2);
    local_a8._M_head_impl = local_100._M_head_impl;
    local_100._M_head_impl = (CExpression *)0x0;
    CMoveStatement::CMoveStatement
              (pCVar6,(unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                       *)&local_f0,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               &local_a8);
    local_a0._M_head_impl = (CStatement *)pCVar6;
    CSeqStatement::CSeqStatement
              (pCVar5,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                       *)&local_e8,
               (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
               &local_a0);
    (this->super_IVisitor)._vptr_IVisitor = (_func_int **)pCVar5;
    if ((CMoveStatement *)local_a0._M_head_impl != (CMoveStatement *)0x0) {
      (*((INode *)&((local_a0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_a0._M_head_impl = (CStatement *)0x0;
    if (local_a8._M_head_impl != (CExpression *)0x0) {
      (*((local_a8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_a8._M_head_impl = (CExpression *)0x0;
    if (local_100._M_head_impl != (CExpression *)0x0) {
      (*((local_100._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if (local_f0._M_head_impl != (CExpression *)0x0) {
      (*((local_f0._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_f0._M_head_impl = (CExpression *)0x0;
    if (local_f8._M_head_impl != (CExpression *)0x0) {
      (*((local_f8._M_head_impl)->super_IExpression).super_INode._vptr_INode[2])();
    }
    if (local_e8._M_head_impl != (CStatement *)0x0) {
      (*((local_e8._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
    }
    local_e8._M_head_impl = (CStatement *)0x0;
  }
  if ((long *)local_60._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_60._0_8_ + 0x10))();
  }
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const IRT::CStatement> IRT::CEseqFloatVisitor::processSourceEseqInCMove(
        const IRT::CExpression *target, const IRT::CEseqExpression *sourceEseq) {

    const CEseqExpression* eseq = dynamic_cast<const CEseqExpression*>(sourceEseq->getExpression());
    assert(eseq == nullptr);

    if (isExpCommuteWithStm(target, sourceEseq->getStatement())) {
        return SMOVE_UNIQ(new CSeqStatement(
                std::move(sourceEseq->getStatement()->Copy()),
                SMOVE_UNIQ(new CMoveStatement(
                        std::move(target->Copy()),
                        std::move(sourceEseq->getExpression()->Copy())
                ))
        ));
    } else {

        const CMemExpression* memTarget = dynamic_cast<const CMemExpression*>(target);
        const CTempExpression* tempTarget = dynamic_cast<const CTempExpression*>(target);

        assert(memTarget != nullptr || tempTarget != nullptr);

        if (memTarget != nullptr) {
            CTemp temp;

            return SMOVE_UNIQ(new CSeqStatement(
                    SMOVE_UNIQ(new CMoveStatement(
                            EMOVE_UNIQ(new CTempExpression(temp)),
                            std::move(memTarget->getAddress()->Copy())
                    )),
                    SMOVE_UNIQ(new CSeqStatement(
                            std::move(sourceEseq->getStatement()->Copy()),
                            SMOVE_UNIQ(new CMoveStatement(
                                    EMOVE_UNIQ(new CMemExpression(EMOVE_UNIQ(new CTempExpression(temp)))),
                                    std::move(sourceEseq->getExpression()->Copy())
                            ))
                    ))
            ));
        }

        if (tempTarget != nullptr) {
            return SMOVE_UNIQ(new CSeqStatement(
                            std::move(sourceEseq->getStatement()->Copy()),
                            SMOVE_UNIQ(new CMoveStatement(
                                    EMOVE_UNIQ(tempTarget->Copy()),
                                    std::move(sourceEseq->getExpression()->Copy())
                            ))
            ));
        }
    }
}